

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstDumper.cc
# Opt level: O0

int __thiscall mcc::AstDumper::Visit(AstDumper *this,Typedef *typedef_stmt)

{
  int iVar1;
  ostream *poVar2;
  element_type *this_00;
  string *psVar3;
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  Typedef *local_18;
  Typedef *typedef_stmt_local;
  AstDumper *this_local;
  
  this->spaces_ = this->spaces_ + 2;
  poVar2 = this->out_;
  iVar1 = this->spaces_;
  local_18 = typedef_stmt;
  typedef_stmt_local = (Typedef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,(long)iVar1,' ',&local_39);
  poVar2 = std::operator<<(poVar2,local_38);
  std::operator<<(poVar2,"<typedef>\n");
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  poVar2 = this->out_;
  iVar1 = this->spaces_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,(long)iVar1,' ',&local_71);
  poVar2 = std::operator<<(poVar2,local_70);
  poVar2 = std::operator<<(poVar2,"<type>");
  poVar2 = operator<<(poVar2,&local_18->type_);
  std::operator<<(poVar2,"</type>\n");
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  poVar2 = this->out_;
  iVar1 = this->spaces_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,(long)(iVar1 + 2),' ',&local_99);
  poVar2 = std::operator<<(poVar2,local_98);
  poVar2 = std::operator<<(poVar2,"<name>");
  this_00 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &local_18->name_);
  psVar3 = Token::String_abi_cxx11_(this_00);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  std::operator<<(poVar2,"</name>\n");
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  poVar2 = this->out_;
  iVar1 = this->spaces_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,(long)iVar1,' ',&local_c1);
  poVar2 = std::operator<<(poVar2,local_c0);
  std::operator<<(poVar2,"<typedef>\n");
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  this->spaces_ = this->spaces_ + -2;
  return 0;
}

Assistant:

int AstDumper::Visit(Typedef& typedef_stmt) {
  spaces_ += TAB_SIZE;
  out_ << std::string(spaces_, ' ') << "<typedef>\n";
  out_ << std::string(spaces_, ' ') << "<type>"
       << typedef_stmt.type_ << "</type>\n";
  out_ << std::string(spaces_ + 2, ' ') << "<name>"
       << typedef_stmt.name_->String() << "</name>\n";
  out_ << std::string(spaces_, ' ') << "<typedef>\n";
  spaces_ -= TAB_SIZE;
  return 0;
}